

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorRequest_0028de88;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->proto_file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->parameter_ = (string *)internal::kEmptyString_abi_cxx11_;
  MergeFrom(this,from);
  return;
}

Assistant:

CodeGeneratorRequest::CodeGeneratorRequest(const CodeGeneratorRequest& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}